

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall
DnsStats::SubmitRegistryNumberAndCount
          (DnsStats *this,uint32_t registry_id,uint32_t number,uint64_t count)

{
  bool local_81;
  undefined1 local_80 [7];
  bool stored;
  DnsHashEntry key;
  uint64_t count_local;
  uint32_t number_local;
  uint32_t registry_id_local;
  DnsStats *this_local;
  
  key.field_6._56_8_ = count;
  DnsHashEntry::DnsHashEntry((DnsHashEntry *)local_80);
  local_81 = false;
  key.hash = key.field_6._56_4_;
  key.registry_id = key.field_6._60_4_;
  key.count._4_4_ = 4;
  key.count._0_4_ = 0;
  key.HashNext._4_4_ = registry_id;
  key.key_type = number;
  BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,(DnsHashEntry *)local_80,true,&local_81);
  DnsHashEntry::~DnsHashEntry((DnsHashEntry *)local_80);
  return;
}

Assistant:

void DnsStats::SubmitRegistryNumberAndCount(uint32_t registry_id, uint32_t number, uint64_t count)
{
    DnsHashEntry key;
    bool stored = false;

    key.count = count;
    key.registry_id = registry_id;
    key.key_length = sizeof(uint32_t);
    key.key_type = 0; /* number */
    key.key_number = number;

    (void)hashTable.InsertOrAdd(&key, true, &stored);
}